

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void looplist(ident *id,char *list,uint *body,bool search)

{
  ulong __n;
  uint *puVar1;
  anon_union_8_3_558327c1_for_ident_6 *paVar2;
  tagval *ptVar3;
  char *__src;
  bool bVar4;
  bool bVar5;
  char *__dest;
  int iVar6;
  long lVar7;
  char *end;
  char *start;
  char *s;
  identstack stack;
  char *local_60;
  char *local_58;
  char *local_50;
  anon_union_8_3_558327c1_for_ident_6 local_48;
  anon_union_4_3_c060dbb1_for_ident_2 local_40;
  anon_union_8_3_5b305ad5_for_ident_8 local_38;
  
  ptVar3 = commandret;
  if (id->type == 4) {
    iVar6 = 0;
    local_50 = list;
    do {
      bVar4 = parselist(&local_50,&local_58,&local_60,&listquotestart,&listquoteend);
      __src = local_58;
      if (!bVar4) {
        bVar4 = iVar6 == 0;
        goto LAB_0012d85b;
      }
      lVar7 = (long)local_60 - (long)local_58;
      __n = lVar7 + 1;
      __dest = (char *)operator_new__(__n);
      strncpy(__dest,__src,__n);
      __dest[lVar7] = '\0';
      if (iVar6 == 0) {
        local_48 = id->field_4;
        local_40 = id->field_2;
        local_38 = id->field_5;
        (id->field_5).stack = (identstack *)&local_48;
        (id->field_2).minval = 3;
        (id->field_4).args = __dest;
        puVar1 = (id->field_3).code;
        if (puVar1 != (uint *)0x0) {
          *puVar1 = *puVar1 - 0x100;
          if ((int)*(id->field_3).code < 0x100) {
            operator_delete__((id->field_3).code);
          }
          (id->field_3).code = (uint *)0x0;
        }
        *(byte *)&id->flags = (byte)id->flags & 0xdf;
      }
      else {
        if ((id->field_2).minval == 3) {
          if ((id->field_4).args != (char *)0x0) {
            operator_delete__((id->field_4).args);
          }
        }
        else {
          (id->field_2).minval = 3;
        }
        puVar1 = (id->field_3).code;
        if (puVar1 != (uint *)0x0) {
          *puVar1 = *puVar1 - 0x100;
          if ((int)*(id->field_3).code < 0x100) {
            operator_delete__((id->field_3).code);
          }
          (id->field_3).code = (uint *)0x0;
        }
        (id->field_4).args = __dest;
      }
      bVar5 = executebool(body);
      ptVar3 = commandret;
      bVar4 = true;
      if ((bVar5) && ((search & 1U) != 0)) {
        commandret->type = 1;
        (ptVar3->super_identval).field_0.i = iVar6;
        bVar4 = false;
        search = false;
      }
      iVar6 = iVar6 + 1;
    } while (bVar4);
    bVar4 = false;
LAB_0012d85b:
    ptVar3 = commandret;
    if ((search & 1U) != 0) {
      commandret->type = 1;
      (ptVar3->super_identval).field_0.i = -1;
    }
    if ((!bVar4) &&
       (paVar2 = (anon_union_8_3_558327c1_for_ident_6 *)(id->field_5).stack,
       paVar2 != (anon_union_8_3_558327c1_for_ident_6 *)0x0)) {
      if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
        operator_delete__((id->field_4).args);
      }
      id->field_2 = *(anon_union_4_3_c060dbb1_for_ident_2 *)(paVar2 + 1);
      id->field_4 = *paVar2;
      puVar1 = (id->field_3).code;
      if (puVar1 != (uint *)0x0) {
        *puVar1 = *puVar1 - 0x100;
        if ((int)*(id->field_3).code < 0x100) {
          operator_delete__((id->field_3).code);
        }
        (id->field_3).code = (uint *)0x0;
      }
      id->field_5 = (anon_union_8_3_5b305ad5_for_ident_8)paVar2[2];
    }
  }
  else if (search) {
    commandret->type = 1;
    (ptVar3->super_identval).field_0.i = -1;
  }
  return;
}

Assistant:

void looplist(ident *id, const char *list, const uint *body, bool search)
{
    if(id->type!=ID_ALIAS) { if(search) intret(-1); return; }
    identstack stack;
    int n = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        char *val = newstring(start, end-start);
        if(n++)
        {
            if(id->valtype == VAL_STR) delete[] id->val.s;
            else id->valtype = VAL_STR;
            cleancode(*id);
            id->val.s = val;
        }
        else
        {
            tagval t;
            t.setstr(val);
            pusharg(*id, t, stack);
            id->flags &= ~IDF_UNKNOWN;
        }
        if(executebool(body) && search) { intret(n-1); search = false; break; }
    }
    if(search) intret(-1);
    if(n) poparg(*id);
}